

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O0

int Hsh_VecManHash(Vec_Int_t *vVec,int nTableSize)

{
  int iVar1;
  int local_1c;
  int Entry;
  int i;
  uint Key;
  int nTableSize_local;
  Vec_Int_t *vVec_local;
  
  Entry = 0;
  for (local_1c = 0; iVar1 = Vec_IntSize(vVec), local_1c < iVar1; local_1c = local_1c + 1) {
    iVar1 = Vec_IntEntry(vVec,local_1c);
    Entry = iVar1 * Hsh_VecManHash::s_Primes[local_1c % 7] + Entry;
  }
  return (uint)Entry % (uint)nTableSize;
}

Assistant:

static inline int Hsh_VecManHash( Vec_Int_t * vVec, int nTableSize )
{
    static unsigned s_Primes[7] = {4177, 5147, 5647, 6343, 7103, 7873, 8147};
    unsigned Key = 0;
    int i, Entry;
    Vec_IntForEachEntry( vVec, Entry, i )
        Key += (unsigned)Entry * s_Primes[i % 7];
    return (int)(Key % nTableSize);
}